

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O3

string * ctemplate::PathJoin(string *__return_storage_ptr__,string *a,string *b)

{
  size_type sVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  __string_type __str;
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  sVar1 = b->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = (a->_M_dataplus)._M_p;
    pcVar7 = pcVar8 + a->_M_string_length;
  }
  else {
    sVar2 = a->_M_string_length;
    if (sVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = (b->_M_dataplus)._M_p;
      pcVar7 = pcVar8 + sVar1;
    }
    else {
      pcVar8 = (b->_M_dataplus)._M_p;
      if (*pcVar8 != '/') {
        pcVar3 = (a->_M_dataplus)._M_p;
        if (pcVar3[sVar2 - 1] == '/') {
          std::operator+(__return_storage_ptr__,a,b);
          return __return_storage_ptr__;
        }
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar3,pcVar3 + sVar2);
        std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_40,(ulong)(b->_M_dataplus)._M_p);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar6) {
          lVar4 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_40 == local_30) {
          return __return_storage_ptr__;
        }
        operator_delete(local_40);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = pcVar8 + sVar1;
    }
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

string PathJoin(const string& a, const string& b) {
  if (b.empty()) return a;                        // degenerate case 1
  if (a.empty()) return b;                        // degenerate case 2
  if (IsAbspath(b)) return b;                     // absolute path
  if (IsDirectory(a)) return a + b;               // 'well-formed' case
  return a + PATH_SEP + b;
}